

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-scanner.hpp
# Opt level: O2

optional<double> __thiscall
yactfr::internal::StrScanner::tryScanConstReal<true,false>(StrScanner *this)

{
  bool bVar1;
  int *piVar2;
  undefined8 uVar3;
  double extraout_XMM0_Qa;
  double dVar4;
  optional<double> oVar5;
  char *strEnd;
  char *local_18;
  
  skipCommentsAndWhitespaces<true,false>(this);
  uVar3 = 0;
  bVar1 = std::regex_search<char_const*,char,std::__cxx11::regex_traits<char>>
                    (this->_at,this->_end,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)_realRegex_abi_cxx11_,0
                    );
  dVar4 = extraout_XMM0_Qa;
  if (bVar1) {
    local_18 = (char *)0x0;
    dVar4 = strtod(this->_at,&local_18);
    if ((dVar4 < INFINITY) && (((dVar4 != 0.0 || (NAN(dVar4))) || (this->_at != local_18)))) {
      piVar2 = __errno_location();
      if (*piVar2 != 0x22) {
        this->_at = local_18;
        uVar3 = 1;
        goto LAB_0027b3fc;
      }
    }
    piVar2 = __errno_location();
    *piVar2 = 0;
    uVar3 = 0;
  }
LAB_0027b3fc:
  oVar5.super_type.m_storage = dVar4;
  oVar5.super_type._0_8_ = uVar3;
  return (optional<double>)oVar5.super_type;
}

Assistant:

boost::optional<double> StrScanner::tryScanConstReal()
{
    this->skipCommentsAndWhitespaces<SkipWsV, SkipCommentsV>();

    /*
     * Validate JSON number format (with fraction and/or exponent part).
     *
     * This is needed because std::strtod() accepts more formats which
     * JSON doesn't support.
     */
    if (!std::regex_search(_at, _end, StrScanner::_realRegex)) {
        return boost::none;
    }

    // parse
    char *strEnd = nullptr;
    const auto val = std::strtod(_at, &strEnd);

    if (val == HUGE_VAL || (val == 0 && &(*_at) == strEnd) || errno == ERANGE) {
        // could not parse
        errno = 0;
        return boost::none;
    }

    // success: update position and return value
    _at += (strEnd - &(*_at));
    return val;
}